

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.hpp
# Opt level: O2

void __thiscall SingletonDatabase::SingletonDatabase(SingletonDatabase *this)

{
  ostream *poVar1;
  istream *piVar2;
  unsigned_long_long uVar3;
  mapped_type *pmVar4;
  string num;
  string name;
  ifstream in;
  
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)&PTR_get_population_00104d68;
  (this->data)._M_h._M_buckets = &(this->data)._M_h._M_single_bucket;
  (this->data)._M_h._M_bucket_count = 1;
  (this->data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->data)._M_h._M_element_count = 0;
  (this->data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->data)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  poVar1 = std::operator<<((ostream *)&std::clog,"SingletonDatabase::SingletonDatabase()");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ifstream::ifstream(&in,"resource.txt",_S_in);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  num._M_dataplus._M_p = (pointer)&num.field_2;
  num._M_string_length = 0;
  num.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&name);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in,(string *)&num);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      uVar3 = std::__cxx11::stoull(&num,(size_t *)0x0,10);
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->data,&name);
      *pmVar4 = uVar3;
    }
  }
  std::__cxx11::string::~string((string *)&num);
  std::__cxx11::string::~string((string *)&name);
  std::ifstream::~ifstream(&in);
  return;
}

Assistant:

SingletonDatabase()
	{
		std::clog << "SingletonDatabase::SingletonDatabase()" << std::endl;

		std::ifstream in("resource.txt");
		std::string name, num;
		while(std::getline(in, name))
		{
			if(std::getline(in, num))
			{
				data[name] = std::stoull(num);
			}
		}
	}